

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void cfgfile::generator::close_namespace(ostream *stream,namespace_stack_t *stack)

{
  ostream *poVar1;
  reference ppnVar2;
  string *psVar3;
  vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
  *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"} /* namespace ");
  ppnVar2 = std::
            vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
            ::back(in_RSI);
  psVar3 = cfg::namespace_t::name_abi_cxx11_(*ppnVar2);
  poVar1 = std::operator<<(poVar1,(string *)psVar3);
  std::operator<<(poVar1," */\n\n");
  std::
  vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
  ::pop_back((vector<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
              *)0x12dfea);
  return;
}

Assistant:

static inline void close_namespace( std::ostream & stream,
	namespace_stack_t & stack )
{
	stream << "} /* namespace "
		<< stack.back()->name()
		<< " */\n\n";

	stack.pop_back();
}